

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

void __thiscall Pda::createDot(Pda *this)

{
  bool bVar1;
  char cVar2;
  Node *pNVar3;
  string *psVar4;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *pvVar5;
  reference ppNVar6;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar7;
  Node *pNVar8;
  char *pcVar9;
  Node *pNVar10;
  allocator<char> local_481;
  string local_480 [8];
  string to_png;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  reference local_380;
  Transition **t2;
  const_iterator __end4;
  const_iterator __begin4;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *__range4;
  undefined1 local_358 [8];
  string label;
  Transition **t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *__range2;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> used;
  Node *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *__range1;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> ends;
  undefined1 local_288 [8];
  string e;
  string local_260 [8];
  string s;
  undefined1 local_230 [8];
  string start;
  ofstream file;
  Pda *this_local;
  
  std::ofstream::ofstream((void *)((long)&start.field_2 + 8),"PDA.dot",_S_out);
  pNVar3 = getStart(this);
  psVar4 = Tjen::Node::getName_abi_cxx11_(pNVar3);
  std::__cxx11::string::string((string *)local_230,(string *)psVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,"digraph {\nrankdir=LR \n",(allocator<char> *)(e.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ends.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,"invis -> ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ends.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage," \n");
  std::__cxx11::string::~string
            ((string *)
             &ends.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator+=(local_260,"invis [style=invisible] \n");
  pvVar5 = getEndNodes(this);
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::vector
            ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range1,pvVar5);
  pvVar5 = getAllNodes(this);
  __end1 = std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::begin(pvVar5);
  node = (Node *)std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::end(pvVar5);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Tjen::Node_*const_*,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
                                     *)&node), bVar1) {
    ppNVar6 = __gnu_cxx::
              __normal_iterator<Tjen::Node_*const_*,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
              ::operator*(&__end1);
    pNVar3 = *ppNVar6;
    bVar1 = checkForNode(this,(vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range1,
                         pNVar3);
    if (bVar1) {
      psVar4 = Tjen::Node::getName_abi_cxx11_(pNVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &used.
                      super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar4,
                     " [shape=doublecircle] \n");
      std::__cxx11::string::operator+=
                (local_260,
                 (string *)
                 &used.
                  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &used.
                  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::vector
              ((vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *)
               &__range2);
    pvVar7 = Tjen::Node::getTransitions(pNVar3);
    __end2 = std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::begin
                       (pvVar7);
    t = (Transition **)
        std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::end
                  (pvVar7);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                                       *)&t), bVar1) {
      label.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
           ::operator*(&__end2);
      bVar1 = checkForTrans(this,(vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                                  *)&__range2,*(Transition **)label.field_2._8_8_);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_358,"[label=\"",(allocator<char> *)((long)&__range4 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        pvVar7 = Tjen::Node::getTransitions(pNVar3);
        __end4 = std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::
                 begin(pvVar7);
        t2 = (Transition **)
             std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::end
                       (pvVar7);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                                           *)&t2), bVar1) {
          local_380 = __gnu_cxx::
                      __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
                      ::operator*(&__end4);
          pNVar10 = Tjen::Node::Transition::getTo(*(Transition **)label.field_2._8_8_);
          pNVar8 = Tjen::Node::Transition::getTo(*local_380);
          if (pNVar10 == pNVar8) {
            cVar2 = Tjen::Node::Transition::getInput(*(Transition **)label.field_2._8_8_);
            std::__cxx11::string::operator+=((string *)local_358,cVar2);
            std::__cxx11::string::operator+=((string *)local_358,", ");
            pcVar9 = Tjen::Node::Transition::getOldStack(*(Transition **)label.field_2._8_8_);
            std::__cxx11::string::operator+=((string *)local_358,*pcVar9);
            psVar4 = Tjen::Node::Transition::getNewstack_abi_cxx11_
                               (*(Transition **)label.field_2._8_8_);
            std::operator+(&local_3c0,"/",psVar4);
            std::operator+(&local_3a0,&local_3c0,"\\n");
            std::__cxx11::string::operator+=((string *)local_358,(string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_3c0);
          }
          __gnu_cxx::
          __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
          ::operator++(&__end4);
        }
        std::__cxx11::string::operator+=((string *)local_358,"\"]");
        psVar4 = Tjen::Node::getName_abi_cxx11_(pNVar3);
        std::operator+(&local_440,psVar4," -> ");
        pNVar10 = Tjen::Node::Transition::getTo(*(Transition **)label.field_2._8_8_);
        psVar4 = Tjen::Node::getName_abi_cxx11_(pNVar10);
        std::operator+(&local_420,&local_440,psVar4);
        std::operator+(&local_400,&local_420,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358);
        std::operator+(&local_3e0,&local_400,"\n");
        std::__cxx11::string::operator+=((string *)local_288,(string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_420);
        std::__cxx11::string::~string((string *)&local_440);
        std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::push_back
                  ((vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *)
                   &__range2,(value_type *)label.field_2._8_8_);
        std::__cxx11::string::~string((string *)local_358);
      }
      __gnu_cxx::
      __normal_iterator<Tjen::Node::Transition_*const_*,_std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::~vector
              ((vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *)
               &__range2);
    __gnu_cxx::
    __normal_iterator<Tjen::Node_*const_*,_std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>_>
    ::operator++(&__end1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&to_png.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,"}")
  ;
  std::__cxx11::string::operator+=(local_260,(string *)(to_png.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(to_png.field_2._M_local_buf + 8));
  std::operator<<((ostream *)(start.field_2._M_local_buf + 8),local_260);
  std::ofstream::close();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_480,"dot PDA.dot -Tpng -o PDA.png",&local_481);
  std::allocator<char>::~allocator(&local_481);
  system("dot PDA.dot -Tpng -o PDA.png");
  std::__cxx11::string::~string(local_480);
  std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::~vector
            ((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)&__range1);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string((string *)local_230);
  std::ofstream::~ofstream((void *)((long)&start.field_2 + 8));
  return;
}

Assistant:

void Pda::createDot() {

    //file aanmaak en init stuff
    std::ofstream file ("PDA.dot");
    std::string start = this->getStart()->getName();
    std::string s = "digraph {\nrankdir=LR \n";
    std::string e = "invis -> "+ start + " \n";
    s+= "invis [style=invisible] \n";

    //endstates dubbele rand geven
    std::vector<Tjen::Node*> ends = this->getEndNodes();
    for (Tjen::Node* node: this->getAllNodes()) {
        if(checkForNode(ends, node)){
            s+= node->getName() + " [shape=doublecircle] \n";
        }


        //transities toevoegen
        std::vector<Tjen::Node::Transition*> used;
        for (auto& t: node->getTransitions()) {
            if (!checkForTrans(used, t)) {
                std::string label = "[label=\"";
                for (auto &t2: node->getTransitions()) {
                    if (t->getTo() == t2->getTo()) {
                        label += t->getInput();
                        label += ", ";
                        label += t->getOldStack();
                        label += "/" + t->getNewstack() + "\\n";
                    }
                }
                label += "\"]";

                e += node->getName() + " -> " + t->getTo()->getName() + label + "\n";
                used.push_back(t);
            }
        }
    }

    s+=e +"}";
    file << s;
    file.close();

    //convergeer commando
    std::string to_png = "dot PDA.dot -Tpng -o PDA.png";
    system("dot PDA.dot -Tpng -o PDA.png");
}